

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O2

string * __thiscall
jbcoin::ValidatorToken::toString_abi_cxx11_(string *__return_storage_ptr__,ValidatorToken *this)

{
  Value *pVVar1;
  int in_ECX;
  Value *value;
  Value jv;
  string local_48;
  Value local_28;
  
  Json::Value::Value(&jv,nullValue);
  strHex<unsigned_char_const*>(&local_48,(jbcoin *)&this->secretKey,&DAT_00000020,in_ECX);
  Json::Value::Value(&local_28,&local_48);
  pVVar1 = Json::Value::operator[](&jv,"validation_secret_key");
  Json::Value::operator=(pVVar1,&local_28);
  Json::Value::~Value(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  Json::Value::Value((Value *)&local_48,&this->manifest);
  pVVar1 = Json::Value::operator[](&jv,"manifest");
  Json::Value::operator=(pVVar1,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  Json::to_string_abi_cxx11_(&local_48,(Json *)&jv,value);
  beast::detail::base64_encode(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  Json::Value::~Value(&jv);
  return __return_storage_ptr__;
}

Assistant:

std::string
ValidatorToken::toString () const
{
    Json::Value jv;
    jv["validation_secret_key"] = strHex(secretKey.data(), secretKey.size());
    jv["manifest"] = manifest;

    return beast::detail::base64_encode(to_string(jv));
}